

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

MetadataResult SetNullValue(ShellState *state,char **azArg,idx_t nArg)

{
  std::__cxx11::string::assign((char *)&state->nullValue);
  return SUCCESS;
}

Assistant:

MetadataResult SetNullValue(ShellState &state, const char **azArg, idx_t nArg) {
	state.nullValue = azArg[1];
	return MetadataResult::SUCCESS;
}